

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

string * __thiscall
cmLinkLineComputer::ConvertToOutputForExisting
          (string *__return_storage_ptr__,cmLinkLineComputer *this,string *input)

{
  OutputFormat format;
  
  format = RESPONSE;
  if (this->ForResponse == false) {
    format = (OutputFormat)this->UseNinjaMulti;
  }
  cmOutputConverter::ConvertToOutputForExisting
            (__return_storage_ptr__,this->OutputConverter,input,format,this->UseWatcomQuote);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLinkLineComputer::ConvertToOutputForExisting(
  std::string const& input)
{
  cmOutputConverter::OutputFormat shellFormat = cmOutputConverter::SHELL;
  if (this->ForResponse) {
    shellFormat = cmOutputConverter::RESPONSE;
  } else if (this->UseNinjaMulti) {
    shellFormat = cmOutputConverter::NINJAMULTI;
  }

  return this->OutputConverter->ConvertToOutputForExisting(
    input, shellFormat, this->UseWatcomQuote);
}